

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptArray::GrowArrayHeadHelperForUnshift<int>
               (JavascriptArray *pArr,uint32 unshiftElements,ScriptContext *scriptContext)

{
  Type *addr;
  SparseArraySegmentBase *seg;
  Recycler *recycler;
  bool bVar1;
  SparseArraySegmentBase *pSVar2;
  SparseArraySegmentBase *this;
  
  addr = &pArr->head;
  seg = (pArr->head).ptr;
  pSVar2 = (seg->next).ptr;
  recycler = scriptContext->recycler;
  bVar1 = IsInlineSegment(seg,pArr);
  this = (pArr->head).ptr;
  if (pSVar2 == (SparseArraySegmentBase *)0x0) {
    if (this == EmptySegment) {
      AllocateHead<int>(pArr);
      this = (pArr->head).ptr;
    }
    pSVar2 = &SparseArraySegment<int>::GrowByMin
                        ((SparseArraySegment<int> *)this,recycler,unshiftElements)->
              super_SparseArraySegmentBase;
  }
  else {
    pSVar2 = &SparseArraySegment<int>::GrowByMinMax
                        ((SparseArraySegment<int> *)this,recycler,unshiftElements,
                         (pSVar2->left + unshiftElements) -
                         (((SparseArraySegmentBase *)&this->left)->left + this->size))->
              super_SparseArraySegmentBase;
  }
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pSVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  if (bVar1) {
    (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])(pArr,seg,0);
    return;
  }
  return;
}

Assistant:

void JavascriptArray::GrowArrayHeadHelperForUnshift(JavascriptArray* pArr, uint32 unshiftElements, ScriptContext * scriptContext)
    {
        SparseArraySegmentBase* nextToHeadSeg = pArr->head->next;
        Recycler* recycler = scriptContext->GetRecycler();

        SparseArraySegmentBase *oldHead = pArr->head;
        bool isInlineSegment = JavascriptArray::IsInlineSegment(oldHead, pArr);
        if (nextToHeadSeg == nullptr)
        {
            pArr->EnsureHead<T>();
            pArr->head = SparseArraySegment<T>::From(pArr->head)->GrowByMin(recycler, unshiftElements);
        }
        else
        {
            pArr->head = SparseArraySegment<T>::From(pArr->head)->GrowByMinMax(recycler, unshiftElements, ((nextToHeadSeg->left + unshiftElements) - pArr->head->left - pArr->head->size));
        }

        if (isInlineSegment)
        {
            pArr->ClearElements(oldHead, 0);
        }
    }